

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O1

void __thiscall
datarate_test::anon_unknown_0::DatarateTestSVC::BasicRateTargetingSVC2TL1SLScreenDropFrameTest
          (DatarateTestSVC *this)

{
  double *val1;
  uint uVar1;
  bool bVar2;
  ParamType *pPVar3;
  undefined8 *puVar4;
  pointer *__ptr;
  SEARCH_METHODS *pSVar5;
  long lVar6;
  long lVar7;
  AssertHelper local_c8;
  AssertHelper local_c0;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  I420VideoSource video;
  
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_optimal_sz = 0x32;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_sz = 100;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_initial_sz = 0x32;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_min_quantizer = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_max_quantizer = 0x34;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_end_usage = AOM_CBR;
  (this->super_DatarateTest).super_EncoderTest.cfg_.g_lag_in_frames = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_dropframe_thresh = 0x1e;
  (this->super_DatarateTest).super_EncoderTest.cfg_.g_error_resilient = 0;
  gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
  _vptr_TestPartResultReporterInterface =
       (_func_int **)&gtest_fatal_failure_checker.original_reporter_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_fatal_failure_checker,"hantro_collage_w352h288.yuv","");
  libaom_test::YUVVideoSource::YUVVideoSource
            (&video.super_YUVVideoSource,(string *)&gtest_fatal_failure_checker,AOM_IMG_FMT_I420,
             0x160,0x120,0x1e,1,0,300);
  video.super_YUVVideoSource.super_VideoSource._vptr_VideoSource =
       (_func_int **)&PTR__YUVVideoSource_01044d00;
  if ((TestPartResultReporterInterface **)
      gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != &gtest_fatal_failure_checker.original_reporter_) {
    operator_delete(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                    _vptr_TestPartResultReporterInterface);
  }
  pPVar3 = testing::
           WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
           ::GetParam();
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate =
       *(uint *)(&DAT_00c826c8 +
                (long)(pPVar3->
                      super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
                      ).super__Tuple_impl<1UL,_libaom_test::TestMode,_int,_unsigned_int,_int>.
                      super__Tuple_impl<2UL,_int,_unsigned_int,_int>.
                      super__Tuple_impl<3UL,_unsigned_int,_int>.super__Tuple_impl<4UL,_int>.
                      super__Head_base<4UL,_int,_false>._M_head_impl * 4);
  (*(this->super_CodecTestWith4Params<libaom_test::TestMode,_int,_unsigned_int,_int>).
    super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
    .super_Test._vptr_Test[8])(this);
  this->screen_mode_ = 1;
  this->number_temporal_layers_ = 2;
  this->number_spatial_layers_ = 1;
  uVar1 = (this->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate;
  this->target_layer_bitrate_[0] = (uVar1 * 0x3c) / 100;
  this->target_layer_bitrate_[1] = uVar1;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      (*(this->super_DatarateTest).super_EncoderTest._vptr_EncoderTest[2])
                (&this->super_DatarateTest,&video);
    }
    bVar2 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar2 == false) {
      if (0 < this->number_spatial_layers_ * this->number_temporal_layers_) {
        lVar6 = 0;
        lVar7 = 0;
        do {
          val1 = (double *)((long)this->effective_datarate_tl + lVar6);
          local_c8.data_ = (AssertHelperData *)((double)this->target_layer_bitrate_[lVar7] * 0.75);
          testing::internal::CmpHelperGE<double,double>
                    ((internal *)&gtest_fatal_failure_checker,"effective_datarate_tl[i]",
                     "target_layer_bitrate_[i] * 0.75",val1,(double *)&local_c8);
          if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                    _vptr_TestPartResultReporterInterface == '\0') {
            testing::Message::Message((Message *)&local_c8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&(local_c8.data_)->line,
                       " The datarate for the file is lower than target by too much!",0x3c);
            if ((undefined8 *)
                CONCAT71(gtest_fatal_failure_checker._9_7_,
                         gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
              pSVar5 = "";
            }
            else {
              pSVar5 = *(SEARCH_METHODS **)
                        CONCAT71(gtest_fatal_failure_checker._9_7_,
                                 gtest_fatal_failure_checker.has_new_fatal_failure_);
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_c0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/svc_datarate_test.cc"
                       ,0x4f2,(char *)pSVar5);
            testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
            testing::internal::AssertHelper::~AssertHelper(&local_c0);
            if (local_c8.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_c8.data_ + 8))();
            }
            puVar4 = (undefined8 *)
                     CONCAT71(gtest_fatal_failure_checker._9_7_,
                              gtest_fatal_failure_checker.has_new_fatal_failure_);
            if (puVar4 == (undefined8 *)0x0) goto LAB_00626c5d;
            if ((undefined8 *)*puVar4 != puVar4 + 2) {
              operator_delete((undefined8 *)*puVar4);
            }
            goto LAB_00626c55;
          }
          puVar4 = (undefined8 *)
                   CONCAT71(gtest_fatal_failure_checker._9_7_,
                            gtest_fatal_failure_checker.has_new_fatal_failure_);
          if (puVar4 != (undefined8 *)0x0) {
            if ((undefined8 *)*puVar4 != puVar4 + 2) {
              operator_delete((undefined8 *)*puVar4);
            }
            operator_delete(puVar4);
          }
          local_c8.data_ = (AssertHelperData *)((double)this->target_layer_bitrate_[lVar7] * 1.8);
          testing::internal::CmpHelperLE<double,double>
                    ((internal *)&gtest_fatal_failure_checker,"effective_datarate_tl[i]",
                     "target_layer_bitrate_[i] * 1.8",val1,(double *)&local_c8);
          if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                    _vptr_TestPartResultReporterInterface == '\0') {
            testing::Message::Message((Message *)&local_c8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&(local_c8.data_)->line,
                       " The datarate for the file is greater than target by too much!",0x3e);
            if ((undefined8 *)
                CONCAT71(gtest_fatal_failure_checker._9_7_,
                         gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
              pSVar5 = "";
            }
            else {
              pSVar5 = *(SEARCH_METHODS **)
                        CONCAT71(gtest_fatal_failure_checker._9_7_,
                                 gtest_fatal_failure_checker.has_new_fatal_failure_);
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_c0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/svc_datarate_test.cc"
                       ,0x4f4,(char *)pSVar5);
            testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
            testing::internal::AssertHelper::~AssertHelper(&local_c0);
            if (local_c8.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_c8.data_ + 8))();
            }
            puVar4 = (undefined8 *)
                     CONCAT71(gtest_fatal_failure_checker._9_7_,
                              gtest_fatal_failure_checker.has_new_fatal_failure_);
            if (puVar4 == (undefined8 *)0x0) goto LAB_00626c5d;
            if ((undefined8 *)*puVar4 != puVar4 + 2) {
              operator_delete((undefined8 *)*puVar4);
            }
            goto LAB_00626c55;
          }
          puVar4 = (undefined8 *)
                   CONCAT71(gtest_fatal_failure_checker._9_7_,
                            gtest_fatal_failure_checker.has_new_fatal_failure_);
          if (puVar4 != (undefined8 *)0x0) {
            if ((undefined8 *)*puVar4 != puVar4 + 2) {
              operator_delete((undefined8 *)*puVar4);
            }
            operator_delete(puVar4);
          }
          lVar7 = lVar7 + 1;
          lVar6 = lVar6 + 8;
        } while (lVar7 < (long)this->number_spatial_layers_ * (long)this->number_temporal_layers_);
      }
      local_c8.data_._0_4_ = this->mismatch_nframes_;
      local_c0.data_._0_4_ = 0x96;
      testing::internal::CmpHelperLE<int,int>
                ((internal *)&gtest_fatal_failure_checker,"(int)GetMismatchFrames()","150",
                 (int *)&local_c8,(int *)&local_c0);
      if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                _vptr_TestPartResultReporterInterface == '\0') {
        testing::Message::Message((Message *)&local_c8);
        if ((undefined8 *)
            CONCAT71(gtest_fatal_failure_checker._9_7_,
                     gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
          pSVar5 = "";
        }
        else {
          pSVar5 = *(SEARCH_METHODS **)
                    CONCAT71(gtest_fatal_failure_checker._9_7_,
                             gtest_fatal_failure_checker.has_new_fatal_failure_);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/svc_datarate_test.cc"
                   ,0x4fe,(char *)pSVar5);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (local_c8.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_c8.data_ + 8))();
        }
      }
      puVar4 = (undefined8 *)
               CONCAT71(gtest_fatal_failure_checker._9_7_,
                        gtest_fatal_failure_checker.has_new_fatal_failure_);
      if (puVar4 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar4 != puVar4 + 2) {
          operator_delete((undefined8 *)*puVar4);
        }
LAB_00626c55:
        operator_delete(puVar4);
      }
      goto LAB_00626c5d;
    }
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            (&local_c8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/svc_datarate_test.cc"
             ,0x4f0,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_c8,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper(&local_c8);
  if (gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != (_func_int **)0x0) {
    (**(code **)(*gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface + 8))();
  }
LAB_00626c5d:
  libaom_test::YUVVideoSource::~YUVVideoSource(&video.super_YUVVideoSource);
  return;
}

Assistant:

virtual void BasicRateTargetingSVC2TL1SLScreenDropFrameTest() {
    cfg_.rc_buf_initial_sz = 50;
    cfg_.rc_buf_optimal_sz = 50;
    cfg_.rc_buf_sz = 100;
    cfg_.rc_dropframe_thresh = 30;
    cfg_.rc_min_quantizer = 0;
    cfg_.rc_max_quantizer = 52;
    cfg_.rc_end_usage = AOM_CBR;
    cfg_.g_lag_in_frames = 0;
    cfg_.g_error_resilient = 0;

    ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352,
                                         288, 30, 1, 0, 300);

    const int bitrate_array[2] = { 60, 100 };
    cfg_.rc_target_bitrate = bitrate_array[GET_PARAM(4)];
    ResetModel();
    screen_mode_ = 1;
    number_temporal_layers_ = 2;
    number_spatial_layers_ = 1;
    target_layer_bitrate_[0] = 60 * cfg_.rc_target_bitrate / 100;
    target_layer_bitrate_[1] = cfg_.rc_target_bitrate;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    for (int i = 0; i < number_temporal_layers_ * number_spatial_layers_; i++) {
      ASSERT_GE(effective_datarate_tl[i], target_layer_bitrate_[i] * 0.75)
          << " The datarate for the file is lower than target by too much!";
      ASSERT_LE(effective_datarate_tl[i], target_layer_bitrate_[i] * 1.8)
          << " The datarate for the file is greater than target by too much!";
    }
#if CONFIG_AV1_DECODER
    // Top temporal layers are non_reference, so exlcude them from
    // mismatch count, since loopfilter/cdef is not applied for these on
    // encoder side, but is always applied on decoder.
    // This means 300 = #frames(300) - #TL2_frames(150).
    // We use LE for screen since loopfilter level can become very small
    // or zero and then the frame is not a mismatch.
    EXPECT_LE((int)GetMismatchFrames(), 150);
#endif
  }